

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_objects.cxx
# Opt level: O2

void __thiscall xray_re::xr_custom_object::load(xr_custom_object *this,xr_reader *r)

{
  uint32_t *value;
  uint16_t *puVar1;
  uint __line;
  size_t sVar2;
  uint16_t *puVar3;
  xr_obj_motion *this_00;
  char *__assertion;
  uint16_t local_1a;
  
  value = &this->m_flags;
  sVar2 = xr_reader::r_chunk<unsigned_int>(r,0xf906,value);
  if (sVar2 == 0) {
    sVar2 = xr_reader::find_chunk(r,0xf900);
    if (sVar2 == 0) {
      __assertion = "0";
      __line = 0x2d;
      goto LAB_00179894;
    }
    *value = 0;
    puVar1 = (r->field_2).m_p_u16;
    puVar3 = puVar1 + 1;
    (r->field_2).m_p_u16 = puVar3;
    if (*puVar1 != 0) {
      *(byte *)value = (byte)*value | 1;
      puVar3 = (r->field_2).m_p_u16;
    }
    (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
    local_1a = *puVar3;
    if (local_1a != 0) {
      *(byte *)value = (byte)*value | 2;
    }
    xr_reader::r_sz(r,&this->m_name);
    sVar2 = xr_reader::r_chunk<unsigned_short>(r,0xf902,&local_1a);
    if ((sVar2 != 0) && (local_1a != 0)) {
      *(byte *)value = (byte)*value | 4;
    }
  }
  else {
    sVar2 = xr_reader::find_chunk(r,0xf907);
    if (sVar2 == 0) {
      __assertion = "0";
      __line = 0x1c;
      goto LAB_00179894;
    }
    xr_reader::r_sz(r,&this->m_name);
  }
  sVar2 = xr_reader::find_chunk(r,0xf903);
  if (sVar2 != 0) {
    xr_reader::r_fvector3(r,&this->m_position);
    xr_reader::r_fvector3(r,&this->m_rotation);
    xr_reader::r_fvector3(r,&this->m_scale);
  }
  sVar2 = xr_reader::find_chunk(r,0xf905);
  if (sVar2 != 0) {
    this_00 = (xr_obj_motion *)operator_new(0x70);
    xr_obj_motion::xr_obj_motion(this_00);
    this->m_motion = this_00;
    (*(this_00->super_xr_motion)._vptr_xr_motion[2])(this_00,r);
  }
  sVar2 = xr_reader::r_chunk<float>(r,0xf908,&this->m_time);
  if ((sVar2 == 0) || (this->m_motion != (xr_obj_motion *)0x0)) {
    return;
  }
  __assertion = "m_motion";
  __line = 0x3b;
LAB_00179894:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_objects.cxx"
                ,__line,"virtual void xray_re::xr_custom_object::load(xr_reader &)");
}

Assistant:

void xr_custom_object::load(xr_reader& r)
{
	if (r.r_chunk(CUSTOMOBJECT_CHUNK_FLAGS, m_flags)) {
		if (!r.find_chunk(CUSTOMOBJECT_CHUNK_NAME))
			xr_not_expected();
		r.r_sz(m_name);
		r.debug_find_chunk();
	} else if (r.find_chunk(CUSTOMOBJECT_CHUNK_PARAMS)) {
		m_flags = 0;
		uint16_t flag = r.r_u16();
		if (flag)
			m_flags |= COF_SELECTED;
		flag = r.r_u16();
		if (flag)
			m_flags |= COF_VISIBLE;
		r.r_sz(m_name);
		r.debug_find_chunk();

		if (r.r_chunk(CUSTOMOBJECT_CHUNK_f902, flag) && flag)
			m_flags |= COF_LOCKED;
	} else {
		xr_not_expected();
	}
	if (r.find_chunk(CUSTOMOBJECT_CHUNK_XFORM)) {
		r.r_fvector3(m_position);
		r.r_fvector3(m_rotation);
		r.r_fvector3(m_scale);
		r.debug_find_chunk();
	}
	if (r.find_chunk(CUSTOMOBJECT_CHUNK_MOTION)) {
		m_motion = new xr_obj_motion();
		m_motion->load(r);
		r.debug_find_chunk();
	}
	if (r.r_chunk(CUSTOMOBJECT_CHUNK_TIME, m_time)) {
		xr_assert(m_motion);
	}
}